

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,array_type *a,
          array_format_info *fmt,comment_type *com,source_location *loc)

{
  floating_type f;
  pointer pbVar1;
  integer_type i;
  bool bVar2;
  array_format aVar3;
  boolean_type *b;
  boolean_format_info *pbVar4;
  string_format_info *psVar5;
  string_type *__str;
  integer_type *piVar6;
  integer_format_info *fmt_00;
  floating_type *pfVar7;
  floating_format_info *fmt_01;
  table_format_info *ptVar8;
  table_type *t;
  serialization_error *this_00;
  array_format aVar9;
  char (*s) [3];
  char (*s_00) [4];
  char (*s_01) [3];
  char (*s_02) [3];
  ulong uVar10;
  pointer pbVar11;
  ulong uVar12;
  basic_value<toml::type_config> *e;
  undefined1 local_188 [120];
  string_type local_110;
  source_location *local_f0;
  string_type local_e8;
  string local_c8;
  source_location local_a8;
  
  aVar3 = fmt->fmt;
  pbVar11 = (a->
            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (aVar3 == default_format) {
    if ((((this->keys_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->keys_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
        (pbVar11 !=
         (a->
         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         )._M_impl.super__Vector_impl_data._M_finish)) &&
       ((com->comments).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (com->comments).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar2 = std::
              all_of<__gnu_cxx::__normal_iterator<toml::basic_value<toml::type_config>const*,std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,toml::detail::serializer<toml::type_config>::operator()[abi:cxx11](std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>const&,toml::array_format_info_const&,toml::preserve_comments_const&,toml::source_location_const&)::_lambda(toml::basic_value<toml::type_config>const&)_1_>
                        ();
      pbVar11 = (a->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      aVar3 = array_of_tables;
      if (bVar2) goto LAB_0034140b;
    }
    pbVar1 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar10 = 0;
    local_f0 = loc;
    while( true ) {
      if (pbVar11 == pbVar1) break;
      aVar3 = multiline;
      if ((pbVar11->comments_).comments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pbVar11->comments_).comments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto switchD_00341212_caseD_5;
      switch(pbVar11->type_) {
      case boolean:
        b = basic_value<toml::type_config>::as_boolean(pbVar11);
        pbVar4 = basic_value<toml::type_config>::as_boolean_fmt(pbVar11);
        source_location::source_location((source_location *)local_188,&pbVar11->region_);
        operator()[abi_cxx11_(&local_110,this,b,pbVar4,(source_location *)local_188);
        goto LAB_003413b3;
      case integer:
        piVar6 = basic_value<toml::type_config>::as_integer(pbVar11);
        i = *piVar6;
        fmt_00 = basic_value<toml::type_config>::as_integer_fmt(pbVar11);
        source_location::source_location((source_location *)local_188,&pbVar11->region_);
        operator()[abi_cxx11_(&local_110,this,i,fmt_00,(source_location *)local_188);
        goto LAB_003413b3;
      case floating:
        pfVar7 = basic_value<toml::type_config>::as_floating(pbVar11);
        f = *pfVar7;
        fmt_01 = basic_value<toml::type_config>::as_floating_fmt(pbVar11);
        source_location::source_location((source_location *)local_188,&pbVar11->region_);
        operator()[abi_cxx11_(&local_110,this,f,fmt_01,(source_location *)local_188);
LAB_003413b3:
        uVar12 = uVar10 + local_110._M_string_length;
        std::__cxx11::string::~string((string *)&local_110);
        source_location::~source_location((source_location *)local_188);
        break;
      case string:
        psVar5 = basic_value<toml::type_config>::as_string_fmt(pbVar11);
        if ((psVar5->fmt == multiline_basic) ||
           (psVar5 = basic_value<toml::type_config>::as_string_fmt(pbVar11),
           psVar5->fmt == multiline_literal)) {
          aVar3 = multiline;
          goto switchD_00341212_caseD_5;
        }
        __str = basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar11);
        std::__cxx11::string::string
                  ((string *)&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
        psVar5 = basic_value<toml::type_config>::as_string_fmt(pbVar11);
        source_location::source_location((source_location *)local_188,&pbVar11->region_);
        operator()(&local_110,this,&local_e8,psVar5,(source_location *)local_188);
        uVar12 = uVar10 + local_110._M_string_length + 2;
        std::__cxx11::string::~string((string *)&local_110);
        source_location::~source_location((source_location *)local_188);
        std::__cxx11::string::~string((string *)&local_e8);
        break;
      case offset_datetime:
      case local_datetime:
      case array:
      case table:
        goto switchD_00341212_caseD_5;
      case local_date:
        uVar12 = uVar10 + 10;
        break;
      default:
        uVar12 = uVar10 + 0xf;
        if (pbVar11->type_ != local_time) {
          uVar12 = uVar10;
        }
      }
      aVar3 = multiline;
      if (0x3c < uVar12) goto switchD_00341212_caseD_5;
      uVar10 = uVar12 + 2;
      pbVar11 = pbVar11 + 1;
    }
    aVar3 = oneline;
switchD_00341212_caseD_5:
    pbVar11 = (a->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    loc = local_f0;
  }
LAB_0034140b:
  aVar9 = multiline;
  if (this->force_inline_ == false) {
    aVar9 = aVar3;
  }
  if (aVar3 != array_of_tables) {
    aVar9 = aVar3;
  }
  pbVar1 = (a->
           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  aVar3 = oneline;
  if (aVar9 != array_of_tables) {
    aVar3 = aVar9;
  }
  if (pbVar11 != pbVar1) {
    aVar3 = aVar9;
  }
  if (aVar3 == oneline) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'[');
    pbVar1 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = (a->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
        pbVar11 = pbVar11 + 1) {
      this->force_inline_ = true;
      operator()[abi_cxx11_((string_type *)local_188,this,pbVar11);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<3ul>((string_type *)local_188,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)", ",s_01);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
    }
    if ((a->
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (a->
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,']');
    this->force_inline_ = false;
  }
  else if (aVar3 == array_of_tables) {
    if ((this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (serialization_error *)__cxa_allocate_exception(0xa0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"array of table must have its key. use format(key, v)",
                 (allocator<char> *)local_188);
      source_location::source_location(&local_a8,loc);
      serialization_error::serialization_error(this_00,&local_c8,&local_a8);
      __cxa_throw(this_00,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (; pbVar11 != pbVar1; pbVar11 = pbVar11 + 1) {
      ptVar8 = basic_value<toml::type_config>::as_table_fmt(pbVar11);
      this->current_indent_ = this->current_indent_ + ptVar8->name_indent;
      ptVar8 = basic_value<toml::type_config>::as_table_fmt(pbVar11);
      format_comments_abi_cxx11_
                ((string_type *)local_188,this,&pbVar11->comments_,ptVar8->indent_type);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      ptVar8 = basic_value<toml::type_config>::as_table_fmt(pbVar11);
      format_indent_abi_cxx11_((string_type *)local_188,this,ptVar8->indent_type);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      ptVar8 = basic_value<toml::type_config>::as_table_fmt(pbVar11);
      this->current_indent_ = this->current_indent_ - ptVar8->name_indent;
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<3ul>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)"[[",s);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      format_keys((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_188,this,&this->keys_);
      if (local_188[0x20] == false) {
        std::__throw_bad_optional_access();
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_188);
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<4ul>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)"]]\n",s_00);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      t = basic_value<toml::type_config>::as_table_abi_cxx11_(pbVar11);
      ptVar8 = basic_value<toml::type_config>::as_table_fmt(pbVar11);
      format_ml_table((string_type *)local_188,this,t,ptVar8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
    ::invoke<3ul>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                  (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                   *)"[\n",(char (*) [3])pbVar1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    std::__cxx11::string::~string((string *)local_188);
    pbVar1 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = (a->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
        pbVar11 = pbVar11 + 1) {
      this->current_indent_ = this->current_indent_ + fmt->body_indent;
      format_comments_abi_cxx11_((string_type *)local_188,this,&pbVar11->comments_,fmt->indent_type)
      ;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      format_indent_abi_cxx11_((string_type *)local_188,this,fmt->indent_type);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      this->current_indent_ = this->current_indent_ - fmt->body_indent;
      this->force_inline_ = true;
      operator()[abi_cxx11_((string_type *)local_188,this,pbVar11);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<3ul>((string_type *)local_188,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x38f854,s_02);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
    }
    this->force_inline_ = false;
    this->current_indent_ = this->current_indent_ + fmt->closing_indent;
    format_indent_abi_cxx11_((string_type *)local_188,this,fmt->indent_type);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    std::__cxx11::string::~string((string *)local_188);
    this->current_indent_ = this->current_indent_ - fmt->closing_indent;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,']');
  }
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const array_type& a, const array_format_info& fmt, const comment_type& com, const source_location& loc) // {{{
    {
        array_format f = fmt.fmt;
        if(fmt.fmt == array_format::default_format)
        {
            // [[in.this.form]], you cannot add a comment to the array itself
            // (but you can add a comment to each table).
            // To keep comments, we need to avoid multiline array-of-tables
            // if array itself has a comment.
            if( ! this->keys_.empty() &&
                ! a.empty() &&
                com.empty() &&
                std::all_of(a.begin(), a.end(), [](const value_type& e) {return e.is_table();}))
            {
                f = array_format::array_of_tables;
            }
            else
            {
                f = array_format::oneline;

                // check if it becomes long
                std::size_t approx_len = 0;
                for(const auto& e : a)
                {
                    // have a comment. cannot be inlined
                    if( ! e.comments().empty())
                    {
                        f = array_format::multiline;
                        break;
                    }
                    // possibly long types ...
                    if(e.is_array() || e.is_table() || e.is_offset_datetime() || e.is_local_datetime())
                    {
                        f = array_format::multiline;
                        break;
                    }
                    else if(e.is_boolean())
                    {
                        approx_len += (*this)(e.as_boolean(), e.as_boolean_fmt(), e.location()).size();
                    }
                    else if(e.is_integer())
                    {
                        approx_len += (*this)(e.as_integer(), e.as_integer_fmt(), e.location()).size();
                    }
                    else if(e.is_floating())
                    {
                        approx_len += (*this)(e.as_floating(), e.as_floating_fmt(), e.location()).size();
                    }
                    else if(e.is_string())
                    {
                        if(e.as_string_fmt().fmt == string_format::multiline_basic ||
                           e.as_string_fmt().fmt == string_format::multiline_literal)
                        {
                            f = array_format::multiline;
                            break;
                        }
                        approx_len += 2 + (*this)(e.as_string(), e.as_string_fmt(), e.location()).size();
                    }
                    else if(e.is_local_date())
                    {
                        approx_len += 10; // 1234-56-78
                    }
                    else if(e.is_local_time())
                    {
                        approx_len += 15; // 12:34:56.789012
                    }

                    if(approx_len > 60) // key, ` = `, `[...]` < 80
                    {
                        f = array_format::multiline;
                        break;
                    }
                    approx_len += 2; // `, `
                }
            }
        }
        if(this->force_inline_ && f == array_format::array_of_tables)
        {
            f = array_format::multiline;
        }
        if(a.empty() && f == array_format::array_of_tables)
        {
            f = array_format::oneline;
        }

        // --------------------------------------------------------------------

        if(f == array_format::array_of_tables)
        {
            if(this->keys_.empty())
            {
                throw serialization_error("array of table must have its key. "
                        "use format(key, v)", loc);
            }
            string_type retval;
            for(const auto& e : a)
            {
                assert(e.is_table());

                this->current_indent_ += e.as_table_fmt().name_indent;
                retval += this->format_comments(e.comments(), e.as_table_fmt().indent_type);
                retval += this->format_indent(e.as_table_fmt().indent_type);
                this->current_indent_ -= e.as_table_fmt().name_indent;

                retval += string_conv<string_type>("[[");
                retval += this->format_keys(this->keys_).value();
                retval += string_conv<string_type>("]]\n");

                retval += this->format_ml_table(e.as_table(), e.as_table_fmt());
            }
            return retval;
        }
        else if(f == array_format::oneline)
        {
            // ignore comments. we cannot emit comments
            string_type retval;
            retval += char_type('[');
            for(const auto& e : a)
            {
                this->force_inline_ = true;
                retval += (*this)(e);
                retval += string_conv<string_type>(", ");
            }
            if( ! a.empty())
            {
                retval.pop_back(); // ` `
                retval.pop_back(); // `,`
            }
            retval += char_type(']');
            this->force_inline_ = false;
            return retval;
        }
        else
        {
            assert(f == array_format::multiline);

            string_type retval;
            retval += string_conv<string_type>("[\n");

            for(const auto& e : a)
            {
                this->current_indent_ += fmt.body_indent;
                retval += this->format_comments(e.comments(), fmt.indent_type);
                retval += this->format_indent(fmt.indent_type);
                this->current_indent_ -= fmt.body_indent;

                this->force_inline_ = true;
                retval += (*this)(e);
                retval += string_conv<string_type>(",\n");
            }
            this->force_inline_ = false;

            this->current_indent_ += fmt.closing_indent;
            retval += this->format_indent(fmt.indent_type);
            this->current_indent_ -= fmt.closing_indent;

            retval += char_type(']');
            return retval;
        }
    }